

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int grapg_5_3::dfs(graph g,int v)

{
  int iVar1;
  enode *peVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  uint uVar6;
  ulong uVar7;
  graph *pgVar8;
  undefined8 *puVar9;
  uint in_stack_00000118;
  int aiStackY_130 [12];
  uint auStackY_100 [12];
  graph in_stack_ffffffffffffff58;
  
  (&visited)[v] = 1;
  peVar2 = (enode *)(g.vexs + v);
  do {
    peVar2 = peVar2->next;
    iVar4 = peVar2->adjvex;
  } while ((&visited)[iVar4] != 0);
  pgVar8 = &g;
  puVar9 = (undefined8 *)&stack0xffffffffffffff58;
  for (lVar5 = 0x15; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *(undefined8 *)pgVar8->vexs;
    pgVar8 = (graph *)&pgVar8->vexs[0].edge;
    puVar9 = puVar9 + 1;
  }
  dfs(in_stack_ffffffffffffff58,iVar4);
  auStackY_100[0] = 0;
  if (1 < (int)in_stack_00000118) {
    __n = (ulong)(in_stack_00000118 - 1) << 2;
    memset(auStackY_100 + 1,0,__n);
    memcpy(aiStackY_130 + 1,&stack0xffffffffffffff64,__n);
  }
  do {
    uVar6 = 0;
    if (1 < (int)in_stack_00000118) {
      uVar7 = 0;
      iVar4 = 0x540be3ff;
      uVar3 = 1;
      do {
        iVar1 = aiStackY_130[uVar3];
        if (iVar1 != 0 && iVar1 < iVar4) {
          uVar7 = uVar3 & 0xffffffff;
          iVar4 = iVar1;
        }
        uVar6 = (uint)uVar7;
        uVar3 = uVar3 + 1;
      } while (in_stack_00000118 != uVar3);
    }
    lVar5 = (long)(int)uVar6;
    printf("%d %d",(ulong)auStackY_100[lVar5],(ulong)uVar6);
    aiStackY_130[lVar5] = 0;
    if (1 < (int)in_stack_00000118) {
      uVar3 = 1;
      do {
        if ((aiStackY_130[uVar3] != 0) &&
           (*(int *)(&stack0xffffffffffffff60 + uVar3 * 4 + lVar5 * 0x28) < aiStackY_130[uVar3])) {
          aiStackY_130[uVar3] = *(int *)(&stack0xffffffffffffff60 + uVar3 * 4 + lVar5 * 0x28);
          auStackY_100[uVar3] = uVar6;
        }
        uVar3 = uVar3 + 1;
      } while (in_stack_00000118 != uVar3);
    }
  } while( true );
}

Assistant:

int dfs(graph g, int v) {
        visited[v] = 1;
        //visit;
        enode *e = g.vexs[v].edge;
        while (e != nullptr) {
            if (visited[e->adjvex] == 0)
                dfs(g, e->adjvex);
            e = e->next;
        }
    }